

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O0

void __thiscall
NmakeMakefileGenerator::writeResponseFileFiles
          (NmakeMakefileGenerator *this,QTextStream *t,ProStringList *files)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ProString *in_RDX;
  QTextStream *in_RSI;
  long in_FS_OFFSET;
  ProString *file;
  ProStringList *__range1;
  int len;
  int maxLineLength;
  ProString escapedFilePath;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar4;
  undefined4 uVar5;
  ProString *str;
  ProString local_50;
  ProString *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 1000;
  iVar4 = 0;
  local_10.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  str = in_RDX;
  local_10 = QList<ProString>::begin
                       ((QList<ProString> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_18.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<ProString>::end
                       ((QList<ProString> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<ProString>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    QList<ProString>::const_iterator::operator*(&local_10);
    memset(&local_50,0xaa,0x30);
    MakefileGenerator::escapeFilePath((MakefileGenerator *)CONCAT44(uVar5,iVar4),in_RDX);
    if (iVar4 != 0) {
      iVar3 = iVar4;
      iVar2 = ProString::length(&local_50);
      if (iVar4 + iVar2 < 0x3e9) {
        QTextStream::operator<<(in_RSI,' ');
        iVar4 = iVar3 + 1;
      }
      else {
        QTextStream::operator<<(in_RSI,'\n');
        iVar4 = 0;
      }
    }
    ::operator<<(in_RSI,str);
    iVar3 = ProString::length(&local_50);
    iVar4 = iVar3 + iVar4;
    ProString::~ProString((ProString *)0x265319);
    QList<ProString>::const_iterator::operator++(&local_10);
  }
  QTextStream::operator<<(in_RSI,'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void NmakeMakefileGenerator::writeResponseFileFiles(QTextStream &t, const ProStringList &files)
{
    // Add line breaks in file lists in reponse files to work around LNK1170.
    // The actual line length limit is 131070, but let's use a smaller limit
    // in case other tools are similarly hampered.
    const int maxLineLength = 1000;
    int len = 0;
    for (const ProString &file : files) {
        const ProString escapedFilePath = escapeFilePath(file);
        if (len) {
            if (len + escapedFilePath.length() > maxLineLength) {
                t << '\n';
                len = 0;
            } else {
                t << ' ';
                len++;
            }
        }
        t << escapedFilePath;
        len += escapedFilePath.length();
    }
    t << '\n';
}